

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_number_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue v;
  JSValue val_00;
  JSValue val_01;
  int iVar1;
  JSValue *in_R8;
  int in_R9D;
  JSValue JVar2;
  double d;
  int in_stack_00000020;
  int base;
  JSValue val;
  JSContext *in_stack_ffffffffffffff90;
  JSValueUnion ctx_00;
  JSValueUnion in_stack_ffffffffffffff98;
  JSValueUnion ctx_01;
  int64_t in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar2.tag = in_stack_ffffffffffffffa0;
  JVar2.u.float64 = in_stack_ffffffffffffff98.float64;
  JVar2 = js_thisNumberValue(in_stack_ffffffffffffff90,JVar2);
  ctx_00 = JVar2.u;
  ctx_01 = (JSValueUnion)JVar2.tag;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    if ((in_R9D == 0) && (iVar1 = JS_IsUndefined(*in_R8), iVar1 == 0)) {
      val_00.tag._0_4_ = in_stack_ffffffffffffffa8;
      val_00.u.ptr = (void *)in_stack_ffffffffffffffa0;
      val_00.tag._4_4_ = in_stack_ffffffffffffffac;
      iVar1 = js_get_radix((JSContext *)ctx_01.ptr,val_00);
      if (iVar1 < 0) {
        v.tag = in_stack_ffffffffffffffa0;
        v.u.ptr = ctx_01.ptr;
        JS_FreeValue((JSContext *)ctx_00.ptr,v);
        local_10.ptr = (void *)(local_10 << 0x20);
        local_8 = 6;
        return _local_10;
      }
    }
    else {
      iVar1 = 10;
    }
    val_01.tag._0_4_ = in_stack_ffffffffffffffa8;
    val_01.u.ptr = (void *)in_stack_ffffffffffffffa0;
    val_01.tag._4_4_ = iVar1;
    iVar1 = JS_ToFloat64Free((JSContext *)ctx_01.ptr,(double *)ctx_00.ptr,val_01);
    if (iVar1 == 0) {
      JVar2 = js_dtoa((JSContext *)val.tag,val.u.float64,base,in_stack_00000020,d._4_4_);
    }
    else {
      local_10.ptr = (void *)(local_10 << 0x20);
      local_8 = 6;
      JVar2 = _local_10;
    }
  }
  _local_10 = JVar2;
  return _local_10;
}

Assistant:

static JSValue js_number_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv, int magic)
{
    JSValue val;
    int base;
    double d;

    val = js_thisNumberValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    if (magic || JS_IsUndefined(argv[0])) {
        base = 10;
    } else {
        base = js_get_radix(ctx, argv[0]);
        if (base < 0)
            goto fail;
    }
    if (JS_ToFloat64Free(ctx, &d, val))
        return JS_EXCEPTION;
    return js_dtoa(ctx, d, base, 0, JS_DTOA_VAR_FORMAT);
 fail:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}